

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.c
# Opt level: O0

int mbedtls_mpi_read_binary(mbedtls_mpi *X,uchar *buf,size_t buflen)

{
  int iVar1;
  size_t nblimbs;
  uchar *Xp;
  size_t overhead;
  size_t limbs;
  int ret;
  size_t buflen_local;
  uchar *buf_local;
  mbedtls_mpi *X_local;
  
  nblimbs = (buflen >> 3) + (long)(int)(uint)((buflen & 7) != 0);
  if (X->n != nblimbs) {
    mbedtls_mpi_free(X);
    mbedtls_mpi_init(X);
    iVar1 = mbedtls_mpi_grow(X,nblimbs);
    if (iVar1 != 0) {
      return iVar1;
    }
  }
  iVar1 = mbedtls_mpi_lset(X,0);
  if ((iVar1 == 0) && (buf != (uchar *)0x0)) {
    memcpy((void *)((long)X->p + (nblimbs * 8 - buflen)),buf,buflen);
    mpi_bigendian_to_host(X->p,nblimbs);
  }
  return iVar1;
}

Assistant:

int mbedtls_mpi_read_binary( mbedtls_mpi *X, const unsigned char *buf, size_t buflen )
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    size_t const limbs    = CHARS_TO_LIMBS( buflen );
    size_t const overhead = ( limbs * ciL ) - buflen;
    unsigned char *Xp;

    MPI_VALIDATE_RET( X != NULL );
    MPI_VALIDATE_RET( buflen == 0 || buf != NULL );

    /* Ensure that target MPI has exactly the necessary number of limbs */
    if( X->n != limbs )
    {
        mbedtls_mpi_free( X );
        mbedtls_mpi_init( X );
        MBEDTLS_MPI_CHK( mbedtls_mpi_grow( X, limbs ) );
    }
    MBEDTLS_MPI_CHK( mbedtls_mpi_lset( X, 0 ) );

    /* Avoid calling `memcpy` with NULL source argument,
     * even if buflen is 0. */
    if( buf != NULL )
    {
        Xp = (unsigned char*) X->p;
        memcpy( Xp + overhead, buf, buflen );

        mpi_bigendian_to_host( X->p, limbs );
    }

cleanup:

    /*
     * This function is also used to import keys. However, wiping the buffers
     * upon failure is not necessary because failure only can happen before any
     * input is copied.
     */
    return( ret );
}